

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

char * __thiscall icu_63::UDataPathIterator::next(UDataPathIterator *this,UErrorCode *pErrorCode)

{
  CharString *this_00;
  uint uVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  __off_t __length;
  int iVar8;
  
  if (U_ZERO_ERROR < *pErrorCode) {
    return (char *)0x0;
  }
  this_00 = &this->pathBuffer;
  do {
    pcVar2 = this->nextPath;
    if (pcVar2 == (char *)0x0) {
      return (char *)0x0;
    }
    if (pcVar2 == (this->itemPath).buffer.ptr) {
      this->nextPath = this->path;
LAB_002cf5d8:
      sVar7 = strlen(pcVar2);
      iVar8 = (int)sVar7;
    }
    else {
      pcVar5 = strchr(pcVar2,0x3a);
      this->nextPath = pcVar5;
      if (pcVar5 == (char *)0x0) goto LAB_002cf5d8;
      iVar8 = (int)pcVar5 - (int)pcVar2;
      this->nextPath = pcVar5 + 1;
    }
    if (iVar8 != 0) {
      (this->pathBuffer).len = 0;
      *(this->pathBuffer).buffer.ptr = '\0';
      CharString::append(this_00,pcVar2,iVar8,pErrorCode);
      pcVar2 = (this->pathBuffer).buffer.ptr;
      pcVar6 = strrchr(pcVar2,0x2f);
      pcVar5 = pcVar2;
      if (pcVar6 != (char *)0x0) {
        pcVar5 = pcVar6 + 1;
      }
      if (((3 < iVar8) && (this->checkLastFour == '\x01')) &&
         (iVar3 = strncmp(pcVar2 + (iVar8 - 4),(this->suffix).ptr_,4), iVar3 == 0)) {
        uVar1 = this->basenameLen;
        iVar3 = strncmp(pcVar5,this->basename,(ulong)uVar1);
        if ((iVar3 == 0) && (sVar7 = strlen(pcVar5), sVar7 == uVar1 + 4)) goto LAB_002cf764;
      }
      if (pcVar2[iVar8 + -1] != '/') {
        if ((3 < iVar8) && (iVar3 = strncmp(pcVar2 + (iVar8 - 4),".dat",4), iVar3 == 0))
        goto LAB_002cf6bb;
        iVar3 = (this->packageStub).len;
        if (((long)iVar3 != 0) &&
           ((iVar3 < iVar8 &&
            (iVar4 = strcmp(pcVar2 + ((long)iVar8 - (long)iVar3),(this->packageStub).buffer.ptr),
            iVar4 == 0)))) {
          CharString::truncate(this_00,(char *)(ulong)(uint)(iVar8 - iVar3),__length);
        }
        CharString::append(this_00,'/',pErrorCode);
      }
      CharString::append(this_00,(this->packageStub).buffer.ptr + 1,(this->packageStub).len + -1,
                         pErrorCode);
      iVar8 = (this->suffix).length_;
      if (iVar8 != 0) {
        if (4 < iVar8) {
          CharString::ensureEndsWithFileSeparator(this_00,pErrorCode);
        }
        CharString::append(this_00,(this->suffix).ptr_,(this->suffix).length_,pErrorCode);
      }
LAB_002cf764:
      return (this_00->buffer).ptr;
    }
LAB_002cf6bb:
    if (this->path == (char *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }